

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_specialspot.cpp
# Opt level: O0

void __thiscall DSpotState::DSpotState(DSpotState *this)

{
  DSpotState *pDVar1;
  DSpotState *this_local;
  
  DThinker::DThinker(&this->super_DThinker,0);
  (this->super_DThinker).super_DObject._vptr_DObject = (_func_int **)&PTR_StaticType_00a06230;
  TArray<FSpotList,_FSpotList>::TArray(&this->SpotLists);
  pDVar1 = ::TObjPtr::operator_cast_to_DSpotState_((TObjPtr *)&SpotState);
  if (pDVar1 == (DSpotState *)0x0) {
    TObjPtr<DSpotState>::operator=(&SpotState,this);
  }
  else {
    I_Error("Only one SpotState is allowed to exist at a time.\nCheck your code.");
  }
  return;
}

Assistant:

DSpotState::DSpotState ()
: DThinker (STAT_INFO)
{
	if (SpotState)
	{
		I_Error ("Only one SpotState is allowed to exist at a time.\nCheck your code.");
	}
	else
	{
		SpotState = this;
	}
}